

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso3.c
# Opt level: O2

void Gia_Iso3Compute(Gia_Man_t *p,Vec_Int_t *vSign)

{
  uint uVar1;
  Gia_Obj_t *pObj;
  ulong uVar2;
  int v;
  
  v = 0;
  while( true ) {
    if (p->nObjs <= v) {
      return;
    }
    pObj = Gia_ManObj(p,v);
    if (pObj == (Gia_Obj_t *)0x0) break;
    uVar2 = *(ulong *)pObj & 0x1fffffff;
    if (uVar2 != 0x1fffffff) {
      Gia_Iso3ComputeEdge(p,pObj,pObj + -uVar2,(uint)(*(ulong *)pObj >> 0x1d) & 1,vSign);
      uVar1 = (uint)*(undefined8 *)pObj;
      if (-1 < (int)uVar1 && (~uVar1 & 0x1fffffff) != 0) {
        uVar1 = (uint)((ulong)*(undefined8 *)pObj >> 0x20);
        Gia_Iso3ComputeEdge(p,pObj,pObj + -(ulong)(uVar1 & 0x1fffffff),uVar1 >> 0x1d & 1,vSign);
      }
    }
    v = v + 1;
  }
  return;
}

Assistant:

void Gia_Iso3Compute( Gia_Man_t * p, Vec_Int_t * vSign )
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) || Gia_ObjIsCo(pObj) )
            Gia_Iso3ComputeEdge( p, pObj, Gia_ObjFanin0(pObj), Gia_ObjFaninC0(pObj), vSign );
        if ( Gia_ObjIsAnd(pObj) )
            Gia_Iso3ComputeEdge( p, pObj, Gia_ObjFanin1(pObj), Gia_ObjFaninC1(pObj), vSign );
    }
}